

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O3

void __thiscall
rlottie::Animation::setValue(Animation *this,Property param_2,string *param_3,long param_4)

{
  _Head_base<0UL,_AnimationImpl_*,_false> _Var1;
  LOTVariant local_48;
  
  _Var1._M_head_impl =
       (this->d)._M_t.super___uniq_ptr_impl<AnimationImpl,_std::default_delete<AnimationImpl>_>._M_t
       .super__Tuple_impl<0UL,_AnimationImpl_*,_std::default_delete<AnimationImpl>_>.
       super__Head_base<0UL,_AnimationImpl_*,_false>._M_head_impl;
  local_48.mTag = Value;
  local_48.impl._0_8_ = 0;
  local_48.impl._8_8_ = 0;
  local_48.impl.colorFunc.super__Function_base._M_manager = (_Manager_type)0x0;
  local_48.impl.colorFunc._M_invoker = (_Invoker_type)0x0;
  local_48.mPropery = param_2;
  if (*(code **)(param_4 + 0x10) != (code *)0x0) {
    (**(code **)(param_4 + 0x10))(&local_48.impl,param_4,2);
    local_48.impl.colorFunc.super__Function_base._M_manager =
         (_Manager_type)*(undefined8 *)(param_4 + 0x10);
    local_48.impl.colorFunc._M_invoker = (_Invoker_type)*(undefined8 *)(param_4 + 0x18);
  }
  if (param_3->_M_string_length != 0) {
    internal::renderer::Composition::setValue
              ((Composition *)((_Var1._M_head_impl)->mRenderer)._M_t,param_3,&local_48);
  }
  LOTVariant::Destroy(&local_48);
  return;
}

Assistant:

void Animation::setValue(Float_Type, Property prop, const std::string &keypath,
                         std::function<float(const FrameInfo &)> &&value)
{
    d->setValue(keypath, LOTVariant(prop, value));
}